

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68020_cmpi_pcdi_8(m68k_info *info)

{
  uint imm;
  ulong uVar1;
  
  if ((info->type & 0x1e) != 0) {
    uVar1 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
    imm = 0xaa;
    if (uVar1 + 2 <= info->code_len) {
      imm = (uint)info->code[uVar1 + 1];
    }
    info->pc = info->pc + 2;
    build_imm_ea(info,0x32,'\x01',imm);
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68020_cmpi_pcdi_8(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68010_PLUS);
	build_imm_ea(info, M68K_INS_CMPI, 1, read_imm_8(info));
}